

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmop.cpp
# Opt level: O2

size_t CVmOpcodes::get_op_size(uchar *op)

{
  byte bVar1;
  
  bVar1 = *op;
  if (bVar1 == 0x90) {
    return (ulong)*(ushort *)(op + 1) * 7 + 5;
  }
  if ((bVar1 != 0x57) && (bVar1 != 0xc)) {
    return (ulong)""[bVar1];
  }
  return (ulong)*(ushort *)(op + 1) + 3;
}

Assistant:

size_t CVmOpcodes::get_op_size(const uchar *op)
{
    switch (*op)
    {
    case OPC_PUSHSTRI:
        return 3 + osrp2(op+1);
        
    case OPC_SWITCH:
        return 1 + 2 + (VMB_DATAHOLDER + 2)*osrp2(op+1) + 2;
        
    case OPC_NAMEDARGTAB:
        return 1 + 2 + osrp2(op+1);

    default:
        /* all others have fixed sizes */
        return op_siz[*op];
    }
}